

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_RbTree.h
# Opt level: O2

void __thiscall
axl::sl::
RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::onErase(RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          *this,Node *node)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *x;
  
  pRVar1 = BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
           ::replaceWithChild(&this->
                               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                              ,node);
  if (node->m_color == RbColor_Red) {
    return;
  }
  while (pRVar1 != (this->
                   super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                   ).m_root) {
    node = (node->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent;
    if ((pRVar1 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) &&
       (pRVar1->m_color != RbColor_Black)) goto LAB_00127bf3;
    x = (node->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left;
    if (pRVar1 == x) {
      x = (node->
          super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
          ).m_right;
      if (x->m_color == RbColor_Red) {
        x->m_color = RbColor_Black;
        node->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateLeft(&this->
                      super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                     ,node);
        x = (node->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_right;
      }
      pRVar1 = (x->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
      if ((pRVar1 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) ||
         (pRVar1->m_color == RbColor_Black)) {
        pRVar2 = (x->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_right;
        if ((pRVar2 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) ||
           (pRVar2->m_color == RbColor_Black)) goto LAB_00127bdf;
LAB_00127b97:
        if (pRVar2->m_color == RbColor_Black) goto LAB_00127b9d;
      }
      else {
        pRVar2 = (x->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_right;
        if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0)
        goto LAB_00127b97;
LAB_00127b9d:
        pRVar1->m_color = RbColor_Black;
        x->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateRight(&this->
                       super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                      ,x);
        x = (node->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_right;
        pRVar2 = (x->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_right;
      }
      x->m_color = node->m_color;
      node->m_color = RbColor_Black;
      pRVar2->m_color = RbColor_Black;
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
      ::rotateLeft(&this->
                    super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                   ,node);
LAB_00127bd3:
      node = (this->
             super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
             ).m_root;
      pRVar1 = node;
    }
    else {
      if (x->m_color == RbColor_Red) {
        x->m_color = RbColor_Black;
        node->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateRight(&this->
                       super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                      ,node);
        x = (node->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_left;
      }
      pRVar1 = (x->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
      if ((pRVar1 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) &&
         (pRVar1->m_color != RbColor_Black)) {
LAB_00127b29:
        x->m_color = node->m_color;
        node->m_color = RbColor_Black;
        pRVar1->m_color = RbColor_Black;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateRight(&this->
                       super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                      ,node);
        goto LAB_00127bd3;
      }
      pRVar2 = (x->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
      if ((pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) &&
         (pRVar2->m_color != RbColor_Black)) {
        if (pRVar1 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
          if (pRVar1->m_color != RbColor_Black) goto LAB_00127b29;
          pRVar2 = (x->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_right;
        }
        pRVar2->m_color = RbColor_Black;
        x->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateLeft(&this->
                      super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                     ,x);
        x = (node->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_left;
        pRVar1 = (x->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_left;
        goto LAB_00127b29;
      }
LAB_00127bdf:
      x->m_color = RbColor_Red;
      pRVar1 = node;
    }
  }
  if (pRVar1 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    return;
  }
LAB_00127bf3:
  pRVar1->m_color = RbColor_Black;
  return;
}

Assistant:

void
	onErase(Node* node) {
		Node* x = this->replaceWithChild(node);
		Node* p = node->m_parent;

		// no need to fixup red node deletion
		if (node->m_color == RbColor_Red)
			return;

		while (x != this->m_root && Node::getColor(x) == RbColor_Black) {
			// due to invariants of RB-tree black node must have a non-null sibling
			// if this sibling is red, both of its children are non-null black

			if (x == p->m_left) {
				Node *w = p->m_right; // non-null, see above

				if (w->m_color == RbColor_Red) {
					w->m_color = RbColor_Black;
					p->m_color = RbColor_Red;
					this->rotateLeft(p);
					w = p->m_right; // non-null black, see above
				}

				// w is non-null black

				if (Node::getColor(w->m_left) == RbColor_Black &&
					Node::getColor(w->m_right) == RbColor_Black) {
					w->m_color = RbColor_Red;
					x = p;
				} else { // at least one of w children is red
					if (Node::getColor(w->m_right) == RbColor_Black) {
						// w->m_pLeft is red
						w->m_left->m_color = RbColor_Black;
						w->m_color = RbColor_Red;
						this->rotateRight(w);
						w = p->m_right; // non-null black (just rotated here)
					}

					w->m_color = p->m_color;
					p->m_color = RbColor_Black;
					w->m_right->m_color = RbColor_Black; // w->m_pRight is non-null

					this->rotateLeft(p);
					x = this->m_root;
				}
			} else {
				Node *w = p->m_left; // non-null, see above

				if (w->m_color == RbColor_Red) {
					w->m_color = RbColor_Black;
					p->m_color = RbColor_Red;
					this->rotateRight(p);
					w = p->m_left; // non-null black, see above
				}

				// w is non-null black

				if (Node::getColor(w->m_left) == RbColor_Black &&
					Node::getColor(w->m_right) == RbColor_Black) {
					w->m_color = RbColor_Red;
					x = p;
				} else { // at least one of w children is red
					if (Node::getColor(w->m_left) == RbColor_Black) {
						// w->m_pRight is red
						w->m_right->m_color = RbColor_Black;
						w->m_color = RbColor_Red;
						this->rotateLeft(w);
						w = p->m_left; // non-null black (just rotated)
					}

					w->m_color = p->m_color;
					p->m_color = RbColor_Black;
					w->m_left->m_color = RbColor_Black; // w->m_pLeft is non-null

					this->rotateRight(p);
					x = this->m_root;
				}
			}

			p = x->m_parent;
		}

		if (x)
			x->m_color = RbColor_Black;

	#if (_AXL_SL_RBTREE_ASSERT_VALID)
		assertValid();
	#endif
	}